

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

void __thiscall BufferedReader::notify(BufferedReader *this,int readerID,uint32_t dataReaded)

{
  int iVar1;
  ReaderData *pRVar2;
  int local_24;
  
  pRVar2 = getReader(this,readerID);
  if (((pRVar2 != (ReaderData *)0x0) &&
      ((this->super_AbstractReader).m_prereadThreshold <= dataReaded)) &&
     (pRVar2->m_notified == false)) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    pRVar2->m_notified = true;
    pRVar2->m_atQueue = pRVar2->m_atQueue + 1;
    SafeQueueWithNotification<int>::push
              (&(this->m_readQueue).super_SafeQueueWithNotification<int>,&local_24);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  }
  return;
}

Assistant:

void BufferedReader::notify(const int readerID, const uint32_t dataReaded)
{
    ReaderData* data = getReader(readerID);
    if (data == nullptr)
        return;
    if (dataReaded >= m_prereadThreshold && !data->m_notified)
    {
        std::lock_guard lock(m_readersMtx);
        data->m_notified = true;
        data->m_atQueue++;
        m_readQueue.push(readerID);
    }
}